

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O3

void duckdb::Binder::ReplaceStarExpression
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *expr,unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *replacement)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  bool bVar4;
  type pPVar5;
  pointer pPVar6;
  string alias;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  _Any_data local_38;
  _Manager_type local_28;
  code *local_20;
  
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(expr);
  bVar4 = StarExpression::IsColumns(pPVar5);
  if (!bVar4) {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr);
    bVar4 = StarExpression::IsStar(pPVar5);
    if (!bVar4) {
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(expr);
      local_38._8_8_ = 0;
      local_20 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:112:13)>
                 ::_M_invoke;
      local_28 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:112:13)>
                 ::_M_manager;
      local_38._M_unused._M_object = replacement;
      ParsedExpressionIterator::EnumerateChildren
                (pPVar5,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                         *)&local_38);
      if (local_28 == (_Manager_type)0x0) {
        return;
      }
      (*local_28)(&local_38,&local_38,__destroy_functor);
      return;
    }
  }
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  pcVar1 = (pPVar6->super_BaseExpression).alias._M_dataplus._M_p;
  local_38._M_unused._M_object = &local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,
             pcVar1 + (pPVar6->super_BaseExpression).alias._M_string_length);
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(replacement);
  (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar6);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ParsedExpression *)0x0;
  _Var2._M_head_impl =
       (expr->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var3._M_head_impl;
  if ((_Var2._M_head_impl != (ParsedExpression *)0x0) &&
     ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
     local_40._M_head_impl != (ParsedExpression *)0x0)) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_38._8_8_ != 0) {
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(expr);
    ::std::__cxx11::string::operator=
              ((string *)&(pPVar6->super_BaseExpression).alias,(string *)local_38._M_pod_data);
  }
  if ((_Manager_type *)local_38._M_unused._0_8_ != &local_28) {
    operator_delete(local_38._M_unused._M_object);
  }
  return;
}

Assistant:

void Binder::ReplaceStarExpression(unique_ptr<ParsedExpression> &expr, unique_ptr<ParsedExpression> &replacement) {
	D_ASSERT(expr);
	if (StarExpression::IsColumns(*expr) || StarExpression::IsStar(*expr)) {
		D_ASSERT(replacement);
		auto alias = expr->GetAlias();
		expr = replacement->Copy();
		if (!alias.empty()) {
			expr->SetAlias(std::move(alias));
		}
		return;
	}
	ParsedExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<ParsedExpression> &child_expr) { ReplaceStarExpression(child_expr, replacement); });
}